

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
mjs::object::add_own_property_names
          (object *this,vector<mjs::string,_std::allocator<mjs::string>_> *names,
          bool check_enumerable)

{
  vector<mjs::string,_std::allocator<mjs::string>_> *this_00;
  bool bVar1;
  property_attribute attributes;
  property local_50;
  gc_heap *local_40;
  property *p;
  property *__end1;
  property *__begin1;
  gc_vector<mjs::object::property> *__range1;
  vector<mjs::string,_std::allocator<mjs::string>_> *pvStack_18;
  bool check_enumerable_local;
  vector<mjs::string,_std::allocator<mjs::string>_> *names_local;
  object *this_local;
  
  __range1._7_1_ = check_enumerable;
  pvStack_18 = names;
  names_local = (vector<mjs::string,_std::allocator<mjs::string>_> *)this;
  __begin1 = (property *)
             gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                       (&this->properties_,this->heap_);
  __end1 = gc_vector<mjs::object::property>::begin((gc_vector<mjs::object::property> *)__begin1);
  p = gc_vector<mjs::object::property>::end((gc_vector<mjs::object::property> *)__begin1);
  do {
    if (__end1 == p) {
      return;
    }
    local_40 = (gc_heap *)__end1;
    if ((__range1._7_1_ & 1) == 0) {
LAB_001935e2:
      this_00 = pvStack_18;
      property::key(&local_50,local_40);
      std::vector<mjs::string,_std::allocator<mjs::string>_>::push_back
                (this_00,(value_type *)&local_50);
      string::~string((string *)&local_50);
    }
    else {
      attributes = property::attributes(__end1);
      bVar1 = has_attributes(attributes,dont_enum);
      if (!bVar1) goto LAB_001935e2;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void object::add_own_property_names(std::vector<string>& names, bool check_enumerable) const {
    for (auto& p : properties_.dereference(heap_)) { 
        if (!check_enumerable || !has_attributes(p.attributes(), property_attribute::dont_enum)) {
            names.push_back(p.key(heap_));
        }
    }
}